

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int ghc::filesystem::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  EnableBitmask<ghc::filesystem::copy_options> EVar4;
  int extraout_EAX;
  directory_entry *pdVar5;
  error_code *in_RCX;
  copy_options in_DX;
  error_code eVar6;
  error_code *in_stack_00000040;
  path *in_stack_00000048;
  directory_iterator iter;
  file_status fs_to;
  file_status fs_from;
  error_code tec;
  undefined6 in_stack_fffffffffffffda8;
  EnableBitmask<ghc::filesystem::copy_options> in_stack_fffffffffffffdae;
  error_code *in_stack_fffffffffffffdb0;
  portable_error err;
  path *in_stack_fffffffffffffdb8;
  error_code *in_stack_fffffffffffffdc0;
  path *in_stack_fffffffffffffdc8;
  path *in_stack_fffffffffffffdd0;
  path *rhs;
  uint in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddc;
  undefined1 in_stack_fffffffffffffddd;
  EnableBitmask<ghc::filesystem::copy_options> in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde1;
  byte bVar7;
  undefined1 uVar8;
  EnableBitmask<ghc::filesystem::copy_options> in_stack_fffffffffffffde4;
  undefined1 in_stack_fffffffffffffde6;
  byte bVar9;
  undefined1 uVar10;
  bool local_1f2;
  bool local_1f1;
  path *in_stack_fffffffffffffe38;
  EVP_PKEY_CTX local_1c0 [32];
  path local_1a0;
  file_status local_180;
  file_status local_178;
  int local_170;
  undefined4 uStack_16c;
  error_code *in_stack_fffffffffffffe98;
  file_status in_stack_fffffffffffffea0;
  path *in_stack_fffffffffffffea8;
  file_status in_stack_fffffffffffffee8;
  path *in_stack_fffffffffffffef0;
  path *in_stack_fffffffffffffef8;
  file_status local_f0;
  int local_e8;
  undefined4 uStack_e4;
  error_category *local_e0;
  file_status local_d8;
  file_status local_d0;
  int local_c8;
  undefined4 uStack_c4;
  error_code *in_stack_ffffffffffffff40;
  byte in_stack_ffffffffffffff4e;
  copy_options cVar11;
  file_status in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff58;
  file_type in_stack_ffffffffffffff5c;
  file_status local_98;
  byte local_8d;
  file_status local_8c;
  file_status local_84;
  file_status local_7c;
  file_status local_74;
  int local_6c;
  int local_68;
  undefined4 uStack_64;
  error_category *local_60;
  file_status local_58;
  file_status local_50;
  file_status local_48;
  file_status local_40;
  file_status local_38 [3];
  error_code *local_20;
  copy_options local_12;
  EVP_PKEY_CTX *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_20 = in_RCX;
  local_12 = in_DX;
  local_10 = src;
  local_8 = dst;
  std::error_code::error_code(in_stack_fffffffffffffdb0);
  file_status::file_status((file_status *)0x28bc24);
  file_status::file_status((file_status *)0x28bc31);
  std::error_code::clear(in_stack_fffffffffffffdb0);
  cVar11 = local_12;
  EVar4 = operator|(skip_symlinks,copy_symlinks);
  EVar4 = operator|(EVar4,create_symlinks);
  EVar4 = operator&(cVar11,EVar4);
  if (EVar4 == none) {
    status(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    file_status::operator=(local_38,&local_50);
    file_status::~file_status(&local_50);
  }
  else {
    symlink_status(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    file_status::operator=(local_38,&local_48);
    file_status::~file_status(&local_48);
  }
  file_status::file_status(&local_58,local_38);
  bVar1 = exists((file_status *)in_stack_fffffffffffffdc0);
  file_status::~file_status(&local_58);
  cVar11 = local_12;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = std::error_code::operator_cast_to_bool(local_20);
    if (!bVar1) {
      eVar6 = detail::make_error_code((portable_error)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      local_60 = eVar6._M_cat;
      local_68 = eVar6._M_value;
      *(ulong *)local_20 = CONCAT44(uStack_64,local_68);
      local_20->_M_cat = local_60;
    }
    local_6c = 1;
    goto LAB_0028c79f;
  }
  EVar4 = operator|(skip_symlinks,create_symlinks);
  EVar4 = operator&(cVar11,EVar4);
  if (EVar4 == none) {
    status(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    file_status::operator=(&local_40,&local_7c);
    file_status::~file_status(&local_7c);
  }
  else {
    symlink_status(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    file_status::operator=(&local_40,&local_74);
    file_status::~file_status(&local_74);
  }
  file_status::file_status(&local_84,local_38);
  bVar2 = is_other((file_status *)
                   CONCAT26(in_stack_fffffffffffffdde,
                            CONCAT15(in_stack_fffffffffffffddd,
                                     CONCAT14(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)))
                  );
  local_8d = 0;
  bVar1 = false;
  in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 & 0xffffff;
  cVar11 = (copy_options)in_stack_ffffffffffffff4e;
  local_1f1 = true;
  if (!bVar2) {
    file_status::file_status(&local_8c,&local_40);
    local_8d = 1;
    bVar2 = is_other((file_status *)
                     CONCAT26(in_stack_fffffffffffffdde,
                              CONCAT15(in_stack_fffffffffffffddd,
                                       CONCAT14(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                      )));
    local_1f1 = true;
    if (!bVar2) {
      file_status::file_status(&local_98,local_38);
      bVar1 = true;
      bVar2 = is_directory((file_status *)0x28bf3b);
      if (bVar2) {
        file_status::file_status((file_status *)&stack0xffffffffffffff5c,&local_40);
        in_stack_ffffffffffffff58 = CONCAT13(1,(int3)in_stack_ffffffffffffff58);
        bVar2 = is_regular_file((file_status *)0x28bf6b);
        local_1f1 = true;
        if (bVar2) goto LAB_0028bfda;
      }
      uVar10 = (undefined1)cVar11;
      file_status::file_status((file_status *)&stack0xffffffffffffff50,&local_40);
      cVar11 = CONCAT11(1,uVar10);
      bVar2 = exists((file_status *)in_stack_fffffffffffffdc0);
      local_1f2 = false;
      if (bVar2) {
        local_1f2 = equivalent(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                               (error_code *)in_stack_fffffffffffffee8);
      }
      local_1f1 = local_1f2;
    }
  }
LAB_0028bfda:
  if ((cVar11 & create_hard_links) != none) {
    file_status::~file_status((file_status *)&stack0xffffffffffffff50);
  }
  if ((in_stack_ffffffffffffff58 & 0x1000000) != 0) {
    file_status::~file_status((file_status *)&stack0xffffffffffffff5c);
  }
  if (bVar1) {
    file_status::~file_status(&local_98);
  }
  if ((local_8d & 1) != 0) {
    file_status::~file_status(&local_8c);
  }
  file_status::~file_status(&local_84);
  if (local_1f1 == false) {
    file_status::file_status(&local_d0,local_38);
    bVar1 = is_symlink((file_status *)0x28c0bc);
    file_status::~file_status(&local_d0);
    if (bVar1) {
      EVar4 = operator&(local_12,skip_symlinks);
      err = (portable_error)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
      if (EVar4 == none) {
        file_status::file_status(&local_d8,&local_40);
        bVar2 = exists((file_status *)in_stack_fffffffffffffdc0);
        bVar1 = false;
        if (!bVar2) {
          EVar4 = operator&(local_12,copy_symlinks);
          bVar1 = EVar4 != none;
        }
        file_status::~file_status(&local_d8);
        if (bVar1) {
          copy_symlink(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0
                      );
        }
        else {
          eVar6 = detail::make_error_code(err);
          local_e0 = eVar6._M_cat;
          local_e8 = eVar6._M_value;
          *(ulong *)local_20 = CONCAT44(uStack_e4,local_e8);
          local_20->_M_cat = local_e0;
        }
      }
    }
    else {
      file_status::file_status(&local_f0,local_38);
      bVar1 = is_regular_file((file_status *)0x28c1f9);
      file_status::~file_status(&local_f0);
      if (bVar1) {
        EVar4 = operator&(local_12,directories_only);
        if (EVar4 == none) {
          EVar4 = operator&(local_12,create_symlinks);
          if (EVar4 == none) {
            EVar4 = operator&(local_12,create_hard_links);
            if (EVar4 == none) {
              file_status::file_status((file_status *)&stack0xfffffffffffffee8,&local_40);
              bVar1 = is_directory((file_status *)0x28c347);
              file_status::~file_status((file_status *)&stack0xfffffffffffffee8);
              if (bVar1) {
                path::filename(in_stack_fffffffffffffe38);
                operator/((path *)CONCAT26(in_stack_fffffffffffffdde,
                                           CONCAT15(in_stack_fffffffffffffddd,
                                                    CONCAT14(in_stack_fffffffffffffddc,
                                                             in_stack_fffffffffffffdd8))),
                          in_stack_fffffffffffffdd0);
                copy_file((path *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (path *)in_stack_ffffffffffffff50,cVar11,in_stack_ffffffffffffff40);
                path::~path((path *)0x28c3dc);
                path::~path((path *)0x28c3e9);
              }
              else {
                copy_file((path *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (path *)in_stack_ffffffffffffff50,cVar11,in_stack_ffffffffffffff40);
              }
            }
            else {
              create_hard_link((path *)in_stack_fffffffffffffdb0,
                               (path *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)
                               ,(error_code *)0x28c320);
            }
          }
          else {
            bVar1 = path::is_absolute((path *)0x28c270);
            if (bVar1) {
              path::path((path *)in_stack_fffffffffffffdb0,
                         (path *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
            }
            else {
              canonical(in_stack_00000048,in_stack_00000040);
            }
            create_symlink((path *)in_stack_fffffffffffffdb0,
                           (path *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8),
                           (error_code *)0x28c2cd);
            path::~path((path *)0x28c2da);
          }
        }
      }
      else {
        file_status::file_status((file_status *)&stack0xfffffffffffffea0,local_38);
        bVar1 = is_directory((file_status *)0x28c440);
        bVar9 = false;
        if (bVar1) {
          in_stack_fffffffffffffde4 = operator&(local_12,create_symlinks);
          bVar9 = in_stack_fffffffffffffde4 != none;
        }
        uVar10 = bVar9;
        file_status::~file_status((file_status *)&stack0xfffffffffffffea0);
        if ((bVar9 & 1) == 0) {
          file_status::file_status(&local_178,local_38);
          bVar1 = is_directory((file_status *)0x28c4f6);
          bVar7 = false;
          if ((bVar1) &&
             (in_stack_fffffffffffffde1 = true, bVar7 = in_stack_fffffffffffffde1, local_12 != none)
             ) {
            in_stack_fffffffffffffdde = operator&(local_12,recursive);
            in_stack_fffffffffffffde1 = in_stack_fffffffffffffdde != none;
            bVar7 = in_stack_fffffffffffffde1;
          }
          uVar8 = bVar7;
          file_status::~file_status(&local_178);
          if ((bVar7 & 1) != 0) {
            file_status::file_status(&local_180,&local_40);
            bVar1 = exists((file_status *)in_stack_fffffffffffffdc0);
            bVar3 = bVar1 ^ 0xff;
            file_status::~file_status(&local_180);
            if ((bVar3 & 1) != 0) {
              create_directory(in_stack_fffffffffffffea8,(path *)in_stack_fffffffffffffea0,
                               in_stack_fffffffffffffe98);
              bVar1 = std::error_code::operator_cast_to_bool(local_20);
              if (bVar1) {
                local_6c = 1;
                goto LAB_0028c79f;
              }
            }
            directory_iterator::directory_iterator
                      ((directory_iterator *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                       in_stack_fffffffffffffdc0);
            while( true ) {
              rhs = &local_1a0;
              directory_iterator::directory_iterator
                        ((directory_iterator *)
                         CONCAT17(uVar10,CONCAT16(in_stack_fffffffffffffde6,
                                                  CONCAT24(in_stack_fffffffffffffde4,
                                                           CONCAT13(bVar9,CONCAT12(uVar8,CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0)))))));
              bVar1 = directory_iterator::operator!=
                                ((directory_iterator *)in_stack_fffffffffffffdb0,
                                 (directory_iterator *)
                                 CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
              in_stack_fffffffffffffdd8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdd8);
              directory_iterator::~directory_iterator((directory_iterator *)0x28c63e);
              if ((in_stack_fffffffffffffdd8 & 0x1000000) == 0) break;
              bVar1 = std::error_code::operator_cast_to_bool(local_20);
              if (!bVar1) {
                pdVar5 = directory_iterator::operator->((directory_iterator *)0x28c678);
                in_stack_fffffffffffffdb0 = (error_code *)directory_entry::path(pdVar5);
                pdVar5 = directory_iterator::operator->((directory_iterator *)0x28c6a8);
                directory_entry::path(pdVar5);
                path::filename(in_stack_fffffffffffffe38);
                operator/((path *)CONCAT26(in_stack_fffffffffffffdde,
                                           CONCAT15(bVar7,CONCAT14(bVar3,in_stack_fffffffffffffdd8))
                                          ),rhs);
                in_stack_fffffffffffffdae = operator|(local_12,0x8000);
                copy((EVP_PKEY_CTX *)in_stack_fffffffffffffdb0,local_1c0);
                path::~path((path *)0x28c729);
                path::~path((path *)0x28c733);
              }
              bVar1 = std::error_code::operator_cast_to_bool(local_20);
              if (bVar1) {
                local_6c = 1;
                goto LAB_0028c76f;
              }
              directory_iterator::increment
                        ((directory_iterator *)in_stack_fffffffffffffdb0,
                         (error_code *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)
                        );
            }
            local_6c = 2;
LAB_0028c76f:
            directory_iterator::~directory_iterator((directory_iterator *)0x28c77c);
            if (local_6c != 2) goto LAB_0028c79f;
          }
        }
        else {
          eVar6 = detail::make_error_code
                            ((portable_error)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
          local_170 = eVar6._M_value;
          *(ulong *)local_20 = CONCAT44(uStack_16c,local_170);
          local_20->_M_cat = eVar6._M_cat;
        }
      }
    }
  }
  else {
    eVar6 = detail::make_error_code((portable_error)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    local_c8 = eVar6._M_value;
    *(ulong *)local_20 = CONCAT44(uStack_c4,local_c8);
    local_20->_M_cat = eVar6._M_cat;
  }
  local_6c = 1;
LAB_0028c79f:
  file_status::~file_status(&local_40);
  file_status::~file_status(local_38);
  return extraout_EAX;
}

Assistant:

GHC_INLINE void copy(const path& from, const path& to, copy_options options, std::error_code& ec) noexcept
{
    std::error_code tec;
    file_status fs_from, fs_to;
    ec.clear();
    if ((options & (copy_options::skip_symlinks | copy_options::copy_symlinks | copy_options::create_symlinks)) != copy_options::none) {
        fs_from = symlink_status(from, ec);
    }
    else {
        fs_from = status(from, ec);
    }
    if (!exists(fs_from)) {
        if (!ec) {
            ec = detail::make_error_code(detail::portable_error::not_found);
        }
        return;
    }
    if ((options & (copy_options::skip_symlinks | copy_options::create_symlinks)) != copy_options::none) {
        fs_to = symlink_status(to, tec);
    }
    else {
        fs_to = status(to, tec);
    }
    if (is_other(fs_from) || is_other(fs_to) || (is_directory(fs_from) && is_regular_file(fs_to)) || (exists(fs_to) && equivalent(from, to, ec))) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
    }
    else if (is_symlink(fs_from)) {
        if ((options & copy_options::skip_symlinks) == copy_options::none) {
            if (!exists(fs_to) && (options & copy_options::copy_symlinks) != copy_options::none) {
                copy_symlink(from, to, ec);
            }
            else {
                ec = detail::make_error_code(detail::portable_error::invalid_argument);
            }
        }
    }
    else if (is_regular_file(fs_from)) {
        if ((options & copy_options::directories_only) == copy_options::none) {
            if ((options & copy_options::create_symlinks) != copy_options::none) {
                create_symlink(from.is_absolute() ? from : canonical(from, ec), to, ec);
            }
#ifndef GHC_OS_WEB
            else if ((options & copy_options::create_hard_links) != copy_options::none) {
                create_hard_link(from, to, ec);
            }
#endif
            else if (is_directory(fs_to)) {
                copy_file(from, to / from.filename(), options, ec);
            }
            else {
                copy_file(from, to, options, ec);
            }
        }
    }